

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ParseInt32Flag(char *str,char *flag,Int32 *value)

{
  char *pcVar1;
  bool in_stack_0000003f;
  char *value_str;
  Int32 *in_stack_00000068;
  char *in_stack_00000070;
  Message *in_stack_00000078;
  char (*in_stack_ffffffffffffff98) [21];
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  Message *in_stack_ffffffffffffffd0;
  undefined1 local_1;
  
  pcVar1 = ParseFlagValue((char *)value,value_str,in_stack_0000003f);
  if (pcVar1 == (char *)0x0) {
    local_1 = false;
  }
  else {
    Message::Message(in_stack_ffffffffffffffd0);
    Message::operator<<((Message *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
    Message::operator<<((Message *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                        (char **)in_stack_ffffffffffffff98);
    local_1 = ParseInt32(in_stack_00000078,in_stack_00000070,in_stack_00000068);
    Message::~Message((Message *)0x18f6b6);
  }
  return local_1;
}

Assistant:

bool ParseInt32Flag(const char* str, const char* flag, Int32* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag,
                    value_str, value);
}